

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O2

exr_result_t exr_decoding_run(exr_const_context_t ctxt,int part_index,exr_decode_pipeline_t *decode)

{
  undefined2 uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ushort uVar5;
  exr_result_t eVar6;
  int iVar7;
  code *UNRECOVERED_JUMPTABLE;
  long lVar8;
  char *pcVar9;
  long lVar10;
  int32_t *piVar11;
  uint uVar12;
  size_t sVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  int32_t x;
  ulong uVar18;
  int32_t x_1;
  int32_t *piVar19;
  undefined8 uStack_50;
  
  if (ctxt == (exr_const_context_t)0x0) {
    return 2;
  }
  if (*ctxt != (_priv_exr_context_t)0x0) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uStack_50 = 7;
LAB_0011f254:
    eVar6 = (*UNRECOVERED_JUMPTABLE)(ctxt,uStack_50);
    return eVar6;
  }
  if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
    eVar6 = (**(code **)(ctxt + 0x48))
                      (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
    return eVar6;
  }
  if (decode == (exr_decode_pipeline_t *)0x0) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uStack_50 = 3;
    goto LAB_0011f254;
  }
  if ((decode->context == ctxt) && (decode->part_index == part_index)) {
    if (decode->read_fn != (_func_exr_result_t__exr_decode_pipeline_ptr *)0x0) {
      lVar8 = *(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8);
      eVar6 = (*decode->read_fn)(decode);
      if (eVar6 != 0) {
        UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
        pcVar9 = "Unable to read pixel data block from context";
        goto LAB_0011f2d3;
      }
      if (((decode->chunk).type & 0xfe) == 2) {
        sVar13 = ((ulong)(decode->decode_flags & 1) +
                 (long)(decode->chunk).height * (long)(decode->chunk).width) * 4;
        if ((decode->chunk).sample_count_table_size != sVar13) {
          eVar6 = internal_decode_alloc_buffer
                            (decode,EXR_TRANSCODE_BUFFER_SAMPLES,&decode->sample_count_table,
                             &decode->sample_count_alloc_size,sVar13);
          if (eVar6 == 0) goto LAB_0011f3a9;
LAB_0011f3e6:
          UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
          pcVar9 = "Decode pipeline unable to update pack / unpack pointers";
          goto LAB_0011f2d3;
        }
        internal_decode_free_buffer
                  (decode,EXR_TRANSCODE_BUFFER_SAMPLES,&decode->sample_count_table,
                   &decode->sample_count_alloc_size);
        decode->sample_count_table = (int32_t *)decode->packed_sample_count_table;
LAB_0011f3a9:
        if ((decode->decode_flags & 4) == 0) goto LAB_0011f3b0;
      }
      else {
LAB_0011f3b0:
        sVar13 = (decode->chunk).unpacked_size;
        if ((decode->chunk).packed_size == sVar13) {
          internal_decode_free_buffer
                    (decode,EXR_TRANSCODE_BUFFER_UNPACKED,&decode->unpacked_buffer,
                     &decode->unpacked_alloc_size);
          decode->unpacked_buffer = decode->packed_buffer;
        }
        else {
          eVar6 = internal_decode_alloc_buffer
                            (decode,EXR_TRANSCODE_BUFFER_UNPACKED,&decode->unpacked_buffer,
                             &decode->unpacked_alloc_size,sVar13);
          if (eVar6 != 0) goto LAB_0011f3e6;
        }
      }
      if ((decode->decompress_fn == (_func_exr_result_t__exr_decode_pipeline_ptr *)0x0) ||
         (eVar6 = (*decode->decompress_fn)(decode), eVar6 == 0)) {
        if ((*(uint *)(lVar8 + 4) & 0xfffffffe) == 2) {
          uVar2 = (decode->chunk).width;
          uVar1 = decode->channel_count;
          uVar3 = (decode->chunk).height;
          lVar8 = 0;
          uVar5 = uVar1;
          if ((short)uVar1 < 1) {
            uVar5 = 0;
          }
          piVar11 = decode->sample_count_table;
          lVar10 = 0;
          for (; (ulong)uVar5 * 0x30 - lVar8 != 0; lVar8 = lVar8 + 0x30) {
            lVar10 = lVar10 + (&decode->channels->bytes_per_element)[lVar8];
          }
          uVar5 = decode->decode_flags;
          uVar12 = 0;
          uVar14 = 0;
          if (0 < (int)uVar2) {
            uVar14 = (ulong)uVar2;
          }
          uVar15 = 0;
          if (0 < (int)uVar3) {
            uVar15 = (ulong)uVar3;
          }
          if ((uVar5 & 1) == 0) {
            iVar7 = 0x1e;
            uVar12 = 0;
            for (uVar17 = 0; uVar17 != uVar15; uVar17 = uVar17 + 1) {
              uVar18 = 0;
              iVar16 = 0;
              while (uVar14 != uVar18) {
                iVar16 = piVar11[uVar18];
                uVar18 = uVar18 + 1;
                if (iVar16 < 0) goto LAB_0011f51d;
              }
              uVar12 = uVar12 + iVar16;
              piVar11 = piVar11 + (int)uVar2;
            }
          }
          else {
            iVar7 = 0x1e;
            piVar19 = piVar11;
            for (uVar17 = 0; uVar17 != uVar15; uVar17 = uVar17 + 1) {
              iVar16 = 0;
              for (uVar18 = 0; uVar14 != uVar18; uVar18 = uVar18 + 1) {
                iVar4 = piVar19[uVar18];
                if (iVar4 < 0) goto LAB_0011f51d;
                piVar19[uVar18] = iVar4 - iVar16;
                iVar16 = iVar4;
              }
              uVar12 = uVar12 + iVar16;
              piVar19 = piVar19 + (int)uVar2;
            }
            piVar11[(int)(uVar3 * uVar2)] = uVar12;
          }
          uVar14 = (decode->chunk).unpacked_size;
          if (lVar10 * (ulong)uVar12 < uVar14 || lVar10 * (ulong)uVar12 - uVar14 == 0) {
            if ((uVar5 & 4) != 0) {
              return 0;
            }
          }
          else {
            iVar7 = (**(code **)(ctxt + 0x40))(ctxt,0x1e,"Corrupt sample count table");
            uVar5 = decode->decode_flags;
LAB_0011f51d:
            if ((uVar5 & 4) != 0) {
              return iVar7;
            }
            if (iVar7 != 0) {
              UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
              pcVar9 = "Decode pipeline unable to unpack deep sample table";
              goto LAB_0011f31d;
            }
          }
        }
        if ((decode->realloc_nonimage_data_fn == (_func_exr_result_t__exr_decode_pipeline_ptr *)0x0)
           || (eVar6 = (*decode->realloc_nonimage_data_fn)(decode), eVar6 == 0)) {
          if ((decode->unpack_and_convert_fn == (_func_exr_result_t__exr_decode_pipeline_ptr *)0x0)
             || (eVar6 = (*decode->unpack_and_convert_fn)(decode), eVar6 == 0)) {
            return 0;
          }
          UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
          pcVar9 = "Decode pipeline unable to unpack and convert data";
        }
        else {
          UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
          pcVar9 = "Decode pipeline unable to realloc deep sample table info";
        }
      }
      else {
        UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
        pcVar9 = "Decode pipeline unable to decompress data";
      }
LAB_0011f2d3:
      eVar6 = (*UNRECOVERED_JUMPTABLE)(ctxt,eVar6,pcVar9,UNRECOVERED_JUMPTABLE);
      return eVar6;
    }
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
    pcVar9 = "Decode pipeline has no read_fn declared";
  }
  else {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
    pcVar9 = "Invalid request for decoding update from different context / part";
  }
  iVar7 = 3;
LAB_0011f31d:
  eVar6 = (*UNRECOVERED_JUMPTABLE)(ctxt,iVar7,pcVar9);
  return eVar6;
}

Assistant:

exr_result_t
exr_decoding_run (
    exr_const_context_t ctxt, int part_index, exr_decode_pipeline_t* decode)
{
    exr_result_t rv;
    EXR_PROMOTE_READ_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (!decode) return pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT);
    if (decode->context != ctxt || decode->part_index != part_index)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid request for decoding update from different context / part");

    if (!decode->read_fn)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Decode pipeline has no read_fn declared");
    rv = decode->read_fn (decode);
    if (rv != EXR_ERR_SUCCESS)
        return pctxt->report_error (
            pctxt, rv, "Unable to read pixel data block from context");

    if (rv == EXR_ERR_SUCCESS) rv = update_pack_unpack_ptrs (decode);
    if (rv != EXR_ERR_SUCCESS)
        return pctxt->report_error (
            pctxt,
            rv,
            "Decode pipeline unable to update pack / unpack pointers");

    if (rv == EXR_ERR_SUCCESS && decode->decompress_fn)
        rv = decode->decompress_fn (decode);
    if (rv != EXR_ERR_SUCCESS)
        return pctxt->report_error (
            pctxt, rv, "Decode pipeline unable to decompress data");

    if (rv == EXR_ERR_SUCCESS &&
        (part->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
         part->storage_mode == EXR_STORAGE_DEEP_TILED))
    {
        rv = unpack_sample_table (pctxt, decode);

        if ((decode->decode_flags & EXR_DECODE_SAMPLE_DATA_ONLY)) return rv;
    }

    if (rv != EXR_ERR_SUCCESS)
        return pctxt->report_error (
            pctxt, rv, "Decode pipeline unable to unpack deep sample table");

    if (rv == EXR_ERR_SUCCESS && decode->realloc_nonimage_data_fn)
        rv = decode->realloc_nonimage_data_fn (decode);
    if (rv != EXR_ERR_SUCCESS)
        return pctxt->report_error (
            pctxt,
            rv,
            "Decode pipeline unable to realloc deep sample table info");

    if (rv == EXR_ERR_SUCCESS && decode->unpack_and_convert_fn)
        rv = decode->unpack_and_convert_fn (decode);
    if (rv != EXR_ERR_SUCCESS)
        return pctxt->report_error (
            pctxt, rv, "Decode pipeline unable to unpack and convert data");

    return rv;
}